

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winfnt.c
# Opt level: O2

FT_UInt32 fnt_cmap_char_next(FNT_CMap cmap,FT_UInt32 *pchar_code)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *pchar_code + 1;
  uVar2 = cmap->first;
  uVar3 = uVar1 - uVar2;
  if (uVar1 < uVar2 || uVar3 == 0) {
    uVar1 = 1;
  }
  else {
    uVar2 = uVar1;
    uVar1 = uVar3 + 1;
    if (cmap->count <= uVar3) {
      uVar2 = 0;
      uVar1 = 0;
    }
  }
  *pchar_code = uVar2;
  return uVar1;
}

Assistant:

static FT_UInt32
  fnt_cmap_char_next( FNT_CMap    cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_UInt    gindex = 0;
    FT_UInt32  result = 0;
    FT_UInt32  char_code = *pchar_code + 1;


    if ( char_code <= cmap->first )
    {
      result = cmap->first;
      gindex = 1;
    }
    else
    {
      char_code -= cmap->first;
      if ( char_code < cmap->count )
      {
        result = cmap->first + char_code;
        gindex = (FT_UInt)( char_code + 1 );
      }
    }

    *pchar_code = result;
    return gindex;
  }